

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Rotate
               (Image *in,uint32_t startXIn,uint32_t startYIn,double centerXIn,double centerYIn,
               Image *out,uint32_t startXOut,uint32_t startYOut,double centerXOut,double centerYOut,
               uint32_t width,uint32_t height,double angle)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  uchar *puVar9;
  uchar *puVar10;
  byte *pbVar11;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double in_XMM1_Qa;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ulong in_XMM2_Qa;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint in_stack_00000008;
  int in_stack_00000010;
  double sum;
  double coeffY;
  double coeffX;
  uint8_t *inX;
  uint32_t y;
  uint32_t x;
  double posY;
  double posX;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint32_t maxY;
  uint32_t maxX;
  double minY;
  double minX;
  double inYPos;
  double inXPos;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  double sinAngle;
  double cosAngle;
  undefined4 in_stack_fffffffffffffebc;
  int iVar28;
  undefined4 in_stack_fffffffffffffec4;
  undefined8 in_stack_fffffffffffffed8;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffef0;
  uint32_t in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff08;
  double dVar29;
  double local_f0;
  uchar *local_e0;
  double local_c0;
  double local_b8;
  uchar *local_a8;
  
  uVar7 = in_stack_00000008;
  iVar28 = in_stack_00000010;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_fffffffffffffef0,(uint32_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffed8,in_stack_ffffffffffffff00,in_stack_ffffffffffffff08
            );
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffec4,iVar28),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffebc,uVar7));
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffec4,iVar28),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffebc,uVar7));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x11f282);
  dVar12 = cos(in_XMM4_Qa);
  dVar13 = sin(in_XMM4_Qa);
  uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  uVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
  puVar9 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  local_a8 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
  local_a8 = local_a8 + (ulong)in_R8D + (ulong)(in_R9D * uVar6);
  puVar10 = local_a8 + in_stack_00000010 * uVar6;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar12;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = in_XMM2_Qa;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar13 * in_XMM3_Qa;
  auVar14 = vfmadd213sd_fma(auVar14,auVar18,auVar24);
  local_b8 = -auVar14._0_8_ + in_XMM0_Qa;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = in_XMM2_Qa;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = -dVar13;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar12 * in_XMM3_Qa;
  auVar14 = vfmadd213sd_fma(auVar15,auVar19,auVar25);
  local_c0 = -auVar14._0_8_ + in_XMM1_Qa;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_c0;
  auVar14 = vcvtusi2sd_avx512f(auVar16,in_ESI);
  auVar15 = vcvtusi2sd_avx512f(auVar14,in_EDX);
  for (; local_a8 != puVar10; local_a8 = local_a8 + uVar6) {
    local_f0 = local_b8;
    dVar29 = local_c0;
    for (local_e0 = local_a8; local_e0 != local_a8 + in_stack_00000008; local_e0 = local_e0 + 1) {
      if ((local_f0 < auVar14._0_8_) ||
         (auVar20._8_8_ = 0, auVar20._0_8_ = dVar29, dVar29 < auVar15._0_8_)) {
        *local_e0 = '\0';
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_f0;
        uVar7 = vcvttsd2usi_avx512f(auVar1);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = dVar29;
        uVar8 = vcvttsd2usi_avx512f(auVar2);
        if ((uVar7 < (in_ESI + in_stack_00000008) - 1) &&
           (uVar8 < (in_EDX + in_stack_00000010) - 1U)) {
          pbVar11 = puVar9 + (ulong)uVar7 + (ulong)(uVar8 * uVar5);
          auVar16 = vcvtusi2sd_avx512f(auVar20,uVar7);
          dVar3 = local_f0 - auVar16._0_8_;
          auVar16 = vcvtusi2sd_avx512f(auVar16,uVar8);
          dVar4 = dVar29 - auVar16._0_8_;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = dVar4;
          dVar4 = 1.0 - dVar4;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = (double)*pbVar11 * (1.0 - dVar3);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = dVar4;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = (double)pbVar11[1] * dVar3 * dVar4;
          auVar16 = vfmadd213sd_fma(auVar26,auVar21,auVar27);
          auVar22._8_8_ = 0;
          auVar22._0_8_ = (double)pbVar11[uVar5] * (1.0 - dVar3);
          auVar16 = vfmadd213sd_fma(auVar17,auVar22,auVar16);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = (double)pbVar11[(ulong)uVar5 + 1] * dVar3;
          auVar16 = vfmadd213sd_fma(auVar17,auVar23,auVar16);
          *local_e0 = (uchar)(int)(auVar16._0_8_ + 0.5);
        }
        else {
          *local_e0 = '\0';
        }
      }
      local_f0 = dVar12 + local_f0;
      dVar29 = dVar29 - dVar13;
    }
    local_b8 = dVar13 + local_b8;
    local_c0 = dVar12 + local_c0;
  }
  return;
}

Assistant:

void Rotate( const Image & in, uint32_t startXIn, uint32_t startYIn, double centerXIn, double centerYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                 double centerXOut, double centerYOut, uint32_t width, uint32_t height, double angle )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        const double cosAngle = cos( angle );
        const double sinAngle = sin( angle );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data();
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;
        const uint8_t * outYEnd = outY + height * rowSizeOut;

        double inXPos = -(cosAngle * centerXOut + sinAngle * centerYOut) + centerXIn;
        double inYPos = -(-sinAngle * centerXOut + cosAngle * centerYOut) + centerYIn;

        const double minX = startXIn;
        const double minY = startYIn;
        const uint32_t maxX = startXIn + width - 1u;
        const uint32_t maxY = startYIn + height - 1u;

        for( ; outY != outYEnd; outY += rowSizeOut, inXPos += sinAngle, inYPos += cosAngle ) {
            uint8_t       * outX = outY;
            const uint8_t * outXEnd = outX + width;

            double posX = inXPos;
            double posY = inYPos;

            for( ; outX != outXEnd; ++outX, posX += cosAngle, posY -= sinAngle ) {
                if( posX < minX || posY < minY ) {
                    (*outX) = 0; // we actually do not know what is beyond an image so we set value 0
                }
                else {
                    const uint32_t x = static_cast<uint32_t>(posX);
                    const uint32_t y = static_cast<uint32_t>(posY);

                    if( x >= maxX || y >= maxY ) {
                        (*outX) = 0; // we actually do not know what is beyond an image so we set value 0
                    }
                    else {
                        const uint8_t * inX = inY + y * rowSizeIn + x;

                        // we use bilinear approximation to find pixel intensity value
                        const double coeffX = posX - x;
                        const double coeffY = posY - y;

                        // Take a weighted mean of four pixels. Use offset of 0.5
                        // so that integer conversion leads to rounding instead of 
                        // simple truncation.
                        const double sum = *(inX) * (1 - coeffX) * (1 - coeffY) + *(inX + 1) * (coeffX) * (1 - coeffY) +
                                           *(inX + rowSizeIn) * (1 - coeffX) * (coeffY) + *(inX + rowSizeIn + 1) * (coeffX) * (coeffY) + 0.5;

                        (*outX) = static_cast<uint8_t>(sum);
                    }
                }
            }
        }
    }